

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_line_ended(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDI;
  char msg [74];
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  undefined1 local_58 [88];
  
  if (*(long *)(*(long *)(in_RDI + 0x9f0) + 0x40) != *(long *)(*(long *)(in_RDI + 0x9f0) + 0x70) + 1
     ) {
    memcpy(local_58,"check failed: (m_state->pos.col == m_state->line_contents.stripped.len+1)",0x4a
          );
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    (*pcVar1)(local_58,0x4a,*(undefined8 *)(in_RDI + 0x9d0));
  }
  *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30) =
       (*(long *)(*(long *)(in_RDI + 0x9f0) + 0x60) - *(long *)(*(long *)(in_RDI + 0x9f0) + 0x70)) +
       *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  *(long *)(*(long *)(in_RDI + 0x9f0) + 0x38) = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x38) + 1;
  *(undefined8 *)(*(long *)(in_RDI + 0x9f0) + 0x40) = 1;
  return;
}

Assistant:

void Parser::_line_ended()
{
    _c4dbgpf("line[{}] ({} cols) ended! offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, m_state->pos.offset, m_state->pos.offset+m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == m_state->line_contents.stripped.len+1);
    m_state->pos.offset += m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    ++m_state->pos.line;
    m_state->pos.col = 1;
}